

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack6_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  
  auVar4 = vpmovsxbd_avx2(ZEXT816(0x101010000000000));
  uVar2 = *(ulong *)in;
  uVar1 = in[2];
  auVar9._8_4_ = 0x3f;
  auVar9._0_8_ = 0x3f0000003f;
  auVar9._12_4_ = 0x3f;
  auVar10._16_4_ = 0x3f;
  auVar10._0_16_ = auVar9;
  auVar10._20_4_ = 0x3f;
  auVar10._24_4_ = 0x3f;
  auVar10._28_4_ = 0x3f;
  *out = (uint)uVar2 & 0x3f;
  auVar4 = vpermd_avx2(auVar4,ZEXT832(uVar2));
  auVar6 = vpsrlvd_avx2(auVar4,_DAT_0018de20);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar2;
  auVar7 = vpshufd_avx(auVar7,0x55);
  auVar8 = vpbroadcastd_avx512vl();
  auVar7 = vpinsrd_avx(auVar7,uVar1,1);
  auVar7 = vpshufd_avx(auVar7,0x50);
  auVar5 = vpsrlvd_avx2(auVar7,_DAT_0019de40);
  auVar4 = vpand_avx2(auVar6,auVar10);
  auVar6 = vpor_avx2(auVar6,auVar8);
  auVar4 = vpblendd_avx2(auVar4,auVar6,0x10);
  *(undefined1 (*) [32])(out + 1) = auVar4;
  auVar3 = vpinsrd_avx(auVar9,(uVar1 & 3) << 4,1);
  auVar7 = vpand_avx(auVar5,auVar9);
  auVar3 = vpor_avx(auVar5,auVar3);
  auVar7 = vpblendd_avx2(auVar7,auVar3,2);
  *(undefined1 (*) [16])(out + 9) = auVar7;
  auVar7 = vpbroadcastd_avx512vl();
  auVar7 = vpsrlvd_avx2(auVar7,_DAT_00193790);
  auVar7 = vpand_avx(auVar7,auVar9);
  *(long *)(out + 0xd) = auVar7._0_8_;
  out[0xf] = uVar1 >> 0x1a;
  return in + 3;
}

Assistant:

const uint32_t *__fastunpack6_16(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 6);
  out++;
  *out = ((*in) >> 6) % (1U << 6);
  out++;
  *out = ((*in) >> 12) % (1U << 6);
  out++;
  *out = ((*in) >> 18) % (1U << 6);
  out++;
  *out = ((*in) >> 24) % (1U << 6);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 4)) << (6 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 6);
  out++;
  *out = ((*in) >> 10) % (1U << 6);
  out++;
  *out = ((*in) >> 16) % (1U << 6);
  out++;
  *out = ((*in) >> 22) % (1U << 6);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 2)) << (6 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 6);
  out++;
  *out = ((*in) >> 8) % (1U << 6);
  out++;
  *out = ((*in) >> 14) % (1U << 6);
  out++;
  *out = ((*in) >> 20) % (1U << 6);
  out++;
  *out = ((*in) >> 26);
  ++in;
  out++;

  return in;
}